

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int floatx80_le_quiet_mipsel(floatx80 a,floatx80 b,float_status *status)

{
  undefined1 auVar1 [12];
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  floatx80 a_00;
  
  uVar5 = b.low;
  uVar6 = a.low;
  uVar2 = a.high;
  if ((long)uVar6 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    uVar4 = b.high;
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 &&
        -1 < (long)uVar5) goto LAB_0071c189;
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
         (uVar2 & 0x7fff) != 0x7fff) &&
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        (uVar4 & 0x7fff) != 0x7fff)) {
      if ((short)(uVar4 ^ uVar2) < 0) {
        if ((short)uVar2 < 0) {
          bVar7 = true;
        }
        else {
          bVar7 = (((b._8_4_ | a._8_4_) * 2 & 0xffff) == 0 && uVar6 == 0) && uVar5 == 0;
        }
      }
      else {
        if ((short)uVar2 < 0) {
          bVar7 = uVar4 < uVar2;
          bVar8 = uVar5 < uVar6;
        }
        else {
          bVar7 = uVar2 < uVar4;
          bVar8 = uVar6 < uVar5;
        }
        bVar7 = (bool)(((bVar8 || uVar6 == uVar5) && uVar2 == uVar4) | bVar7);
      }
      goto LAB_0071c190;
    }
    iVar3 = floatx80_is_signaling_nan_mipsel(a,status);
    if (iVar3 != 0) goto LAB_0071c189;
    auVar1 = b._0_12_;
    a_00._12_4_ = 0;
    a_00.low = auVar1._0_8_;
    a_00.high = auVar1._8_2_;
    a_00._10_2_ = auVar1._10_2_;
    iVar3 = floatx80_is_signaling_nan_mipsel(a_00,status);
    if (iVar3 != 0) goto LAB_0071c189;
  }
  else {
LAB_0071c189:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  bVar7 = false;
LAB_0071c190:
  return (int)bVar7;
}

Assistant:

int floatx80_le_quiet(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return 0;
    }
    if (    (    ( extractFloatx80Exp( a ) == 0x7FFF )
              && (uint64_t) ( extractFloatx80Frac( a )<<1 ) )
         || (    ( extractFloatx80Exp( b ) == 0x7FFF )
              && (uint64_t) ( extractFloatx80Frac( b )<<1 ) )
       ) {
        if (floatx80_is_signaling_nan(a, status)
         || floatx80_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloatx80Sign( a );
    bSign = extractFloatx80Sign( b );
    if ( aSign != bSign ) {
        return
               aSign
            || (    ( ( (uint16_t) ( ( a.high | b.high )<<1 ) ) | a.low | b.low )
                 == 0 );
    }
    return
          aSign ? le128( b.high, b.low, a.high, a.low )
        : le128( a.high, a.low, b.high, b.low );

}